

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLin>
               (GetterYs<unsigned_char> *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  int iVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *gp;
  int iVar8;
  float fVar9;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  TransformerLinLin *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar6 = getter->Count;
    local_48 = iVar6 + -1;
    iVar8 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar8].Min;
    local_3c.x = (float)(GImPlot->Mx *
                         ((getter->XScale * 0.0 + getter->X0) - (pIVar4->XAxis).Range.Min) +
                        (double)IVar2.x);
    local_3c.y = (float)(GImPlot->My[iVar8] *
                         ((double)getter->Ys
                                  [(long)((getter->Offset % iVar6 + iVar6) % iVar6) *
                                   (long)getter->Stride] - pIVar4->YAxis[iVar8].Range.Min) +
                        (double)IVar2.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLin> *)
               local_58,DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar6 = getter->Count;
    iVar8 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar8].Min;
    local_58._4_4_ =
         (undefined4)
         (GImPlot->My[iVar8] *
          ((double)getter->Ys
                   [(long)((getter->Offset % iVar6 + iVar6) % iVar6) * (long)getter->Stride] -
          pIVar4->YAxis[iVar8].Range.Min) + (double)IVar2.y);
    local_58._0_4_ =
         (undefined4)
         (GImPlot->Mx * ((getter->XScale * 0.0 + getter->X0) - (pIVar4->XAxis).Range.Min) +
         (double)IVar2.x);
    if (1 < iVar6) {
      iVar8 = 1;
      pIVar7 = GImPlot;
      local_60 = transformer;
      do {
        iVar3 = transformer->YAxis;
        IVar2 = pIVar7->PixelRange[iVar3].Min;
        local_68.x = (float)(pIVar7->Mx *
                             (((double)iVar8 * getter->XScale + getter->X0) -
                             (pIVar7->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
        local_68.y = (float)(pIVar7->My[iVar3] *
                             ((double)getter->Ys
                                      [(long)(((getter->Offset + iVar8) % iVar6 + iVar6) % iVar6) *
                                       (long)getter->Stride] -
                             pIVar7->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y);
        pIVar4 = pIVar5->CurrentPlot;
        fVar9 = (float)local_58._4_4_;
        if (local_68.y <= (float)local_58._4_4_) {
          fVar9 = local_68.y;
        }
        if ((fVar9 < (pIVar4->PlotRect).Max.y) &&
           (fVar9 = (float)(~-(uint)(local_68.y <= (float)local_58._4_4_) & (uint)local_68.y |
                           -(uint)(local_68.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
          fVar9 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar9 = local_68.x;
          }
          if ((fVar9 < (pIVar4->PlotRect).Max.x) &&
             (fVar9 = (float)(-(uint)(local_68.x <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x),
             (pIVar4->PlotRect).Min.x <= fVar9 && fVar9 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_68,col,line_weight);
            iVar6 = getter->Count;
            transformer = local_60;
            pIVar7 = GImPlot;
          }
        }
        iVar8 = iVar8 + 1;
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
      } while (iVar8 < iVar6);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}